

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

FFSVarRec_conflict CreateVarRec(SstStream Stream,char *ArrayName)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  FFSVarRec_conflict pFVar4;
  char *pcVar5;
  size_t *psVar6;
  size_t **ppsVar7;
  void **ppvVar8;
  size_t __size;
  
  piVar2 = (int *)Stream->ReaderMarshalData;
  pvVar3 = realloc(*(void **)(piVar2 + 2),(long)*piVar2 * 8 + 8);
  *(void **)(piVar2 + 2) = pvVar3;
  pFVar4 = (FFSVarRec_conflict)calloc(1,0x60);
  pcVar5 = strdup(ArrayName);
  pFVar4->VarName = pcVar5;
  __size = (size_t)Stream->WriterCohortSize;
  psVar6 = (size_t *)calloc(8,__size);
  pFVar4->PerWriterMetaFieldOffset = psVar6;
  ppsVar7 = (size_t **)calloc(8,__size);
  pFVar4->PerWriterStart = ppsVar7;
  psVar6 = (size_t *)calloc(8,__size);
  pFVar4->PerWriterBlockStart = psVar6;
  psVar6 = (size_t *)calloc(8,__size);
  pFVar4->PerWriterBlockCount = psVar6;
  ppsVar7 = (size_t **)calloc(8,__size);
  pFVar4->PerWriterCounts = ppsVar7;
  ppvVar8 = (void **)calloc(8,__size);
  pFVar4->PerWriterIncomingData = ppvVar8;
  psVar6 = (size_t *)calloc(8,__size);
  pFVar4->PerWriterIncomingSize = psVar6;
  iVar1 = *piVar2;
  *piVar2 = iVar1 + 1;
  *(FFSVarRec_conflict *)((long)pvVar3 + (long)iVar1 * 8) = pFVar4;
  return pFVar4;
}

Assistant:

static FFSVarRec CreateVarRec(SstStream Stream, const char *ArrayName)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    Info->VarList = realloc(Info->VarList, sizeof(Info->VarList[0]) * (Info->VarCount + 1));
    FFSVarRec Ret = calloc(1, sizeof(struct FFSVarRec));
    Ret->VarName = strdup(ArrayName);
    Ret->PerWriterMetaFieldOffset = calloc(sizeof(size_t), Stream->WriterCohortSize);
    Ret->PerWriterStart = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterBlockStart = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterBlockCount = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterCounts = calloc(sizeof(size_t *), Stream->WriterCohortSize);
    Ret->PerWriterIncomingData = calloc(sizeof(void *), Stream->WriterCohortSize);
    Ret->PerWriterIncomingSize = calloc(sizeof(size_t), Stream->WriterCohortSize);
    Info->VarList[Info->VarCount++] = Ret;
    return Ret;
}